

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

Name getMemoryName(BinaryenModuleRef module,char *memoryName)

{
  IString IVar1;
  size_type sVar2;
  reference this;
  pointer pMVar3;
  char *memoryName_local;
  BinaryenModuleRef module_local;
  char *local_10;
  
  if (memoryName == (char *)0x0) {
    sVar2 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&module->memories);
    if (sVar2 == 1) {
      this = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[](&module->memories,0);
      pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this);
      module_local = (BinaryenModuleRef)
                     (pMVar3->super_Importable).super_Named.name.super_IString.str._M_len;
      local_10 = (pMVar3->super_Importable).super_Named.name.super_IString.str._M_str;
      goto LAB_013c48d1;
    }
  }
  wasm::Name::Name((Name *)&module_local,memoryName);
LAB_013c48d1:
  IVar1.str._M_str = local_10;
  IVar1.str._M_len = (size_t)module_local;
  return (IString)(IString)IVar1.str;
}

Assistant:

static Name getMemoryName(BinaryenModuleRef module, const char* memoryName) {
  if (memoryName == nullptr && module->memories.size() == 1) {
    return module->memories[0]->name;
  }

  return memoryName;
}